

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_test.hpp
# Opt level: O2

void __thiscall
test_impl::R<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&>::
oops<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
          (R<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&> *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *u)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,"> ERROR: CHECK failed \"");
  poVar1 = std::operator<<(poVar1,*(char **)(this + 8));
  poVar1 = std::operator<<(poVar1,"\"\n");
  poVar1 = std::operator<<(poVar1,"> \t");
  poVar1 = std::operator<<(poVar1,*(char **)this);
  poVar1 = std::operator<<(poVar1,'(');
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,*(int *)(this + 0x20));
  poVar1 = std::operator<<(poVar1,')');
  poVar1 = std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<(poVar1,"> \t in function \"");
  poVar1 = std::operator<<(poVar1,*(char **)(this + 0x10));
  std::operator<<(poVar1,"\"\n");
  if (this[0x24] == (R<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&>)0x1)
  {
    poVar1 = std::operator<<((ostream *)&std::cerr,"> \tEXPECTED: ");
    poVar1 = std::operator<<(poVar1,"<non-streamable type>");
    poVar1 = std::operator<<(poVar1,"\n> \tACTUAL: ");
    poVar1 = std::operator<<(poVar1,"<non-streamable type>");
    std::operator<<(poVar1,'\n');
  }
  test_failures()::test_failures = test_failures()::test_failures + 1;
  return;
}

Assistant:

void oops(U const &u) const
        {
            std::cerr
                << "> ERROR: CHECK failed \"" << expr_ << "\"\n"
                << "> \t" << filename_ << '(' << lineno_ << ')' << '\n'
                << "> \t in function \"" << func_ << "\"\n";
            if(dismissed_)
                std::cerr
                    << "> \tEXPECTED: " << stream(u) << "\n> \tACTUAL: " << stream(t_) << '\n';
            ++test_failures();
        }